

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeTextureApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::copyteximage2d_max_level
               (NegativeTestContext *ctx)

{
  NegativeTestContext *this;
  int iVar1;
  allocator<char> local_69;
  deUint32 log2MaxCubemapSize;
  int local_48;
  deUint32 log2MaxTextureSize;
  allocator<char> local_31;
  string local_30;
  NegativeTestContext *local_10;
  NegativeTestContext *ctx_local;
  
  local_10 = ctx;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,
             "GL_INVALID_VALUE is generated if level is greater than log_2(GL_MAX_TEXTURE_SIZE).",
             &local_31);
  NegativeTestContext::beginSection(ctx,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  iVar1 = NegativeTestContext::getInteger(local_10,0xd33);
  local_48 = ::deLog2Floor32(iVar1);
  local_48 = local_48 + 1;
  glu::CallLogWrapper::glCopyTexImage2D
            (&local_10->super_CallLogWrapper,0xde1,local_48,0x1907,0,0,0x40,0x40,0);
  NegativeTestContext::expectError(local_10,0x501);
  NegativeTestContext::endSection(local_10);
  this = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&log2MaxCubemapSize,
             "GL_INVALID_VALUE is generated if level is greater than log_2(GL_MAX_CUBE_MAP_TEXTURE_SIZE)."
             ,&local_69);
  NegativeTestContext::beginSection(this,(string *)&log2MaxCubemapSize);
  std::__cxx11::string::~string((string *)&log2MaxCubemapSize);
  std::allocator<char>::~allocator(&local_69);
  iVar1 = NegativeTestContext::getInteger(local_10,0x851c);
  iVar1 = ::deLog2Floor32(iVar1);
  iVar1 = iVar1 + 1;
  glu::CallLogWrapper::glCopyTexImage2D
            (&local_10->super_CallLogWrapper,0x8515,iVar1,0x1907,0,0,0x10,0x10,0);
  NegativeTestContext::expectError(local_10,0x501);
  glu::CallLogWrapper::glCopyTexImage2D
            (&local_10->super_CallLogWrapper,0x8517,iVar1,0x1907,0,0,0x10,0x10,0);
  NegativeTestContext::expectError(local_10,0x501);
  glu::CallLogWrapper::glCopyTexImage2D
            (&local_10->super_CallLogWrapper,0x8519,iVar1,0x1907,0,0,0x10,0x10,0);
  NegativeTestContext::expectError(local_10,0x501);
  glu::CallLogWrapper::glCopyTexImage2D
            (&local_10->super_CallLogWrapper,0x8516,iVar1,0x1907,0,0,0x10,0x10,0);
  NegativeTestContext::expectError(local_10,0x501);
  glu::CallLogWrapper::glCopyTexImage2D
            (&local_10->super_CallLogWrapper,0x8518,iVar1,0x1907,0,0,0x10,0x10,0);
  NegativeTestContext::expectError(local_10,0x501);
  glu::CallLogWrapper::glCopyTexImage2D
            (&local_10->super_CallLogWrapper,0x851a,iVar1,0x1907,0,0,0x10,0x10,0);
  NegativeTestContext::expectError(local_10,0x501);
  NegativeTestContext::endSection(local_10);
  return;
}

Assistant:

void copyteximage2d_max_level (NegativeTestContext& ctx)
{
	ctx.beginSection("GL_INVALID_VALUE is generated if level is greater than log_2(GL_MAX_TEXTURE_SIZE).");
	deUint32 log2MaxTextureSize = deLog2Floor32(ctx.getInteger(GL_MAX_TEXTURE_SIZE)) + 1;
	ctx.glCopyTexImage2D(GL_TEXTURE_2D, log2MaxTextureSize, GL_RGB, 0, 0, 64, 64, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if level is greater than log_2(GL_MAX_CUBE_MAP_TEXTURE_SIZE).");
	deUint32 log2MaxCubemapSize = deLog2Floor32(ctx.getInteger(GL_MAX_CUBE_MAP_TEXTURE_SIZE)) + 1;
	ctx.glCopyTexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_X, log2MaxCubemapSize, GL_RGB, 0, 0, 16, 16, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glCopyTexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_Y, log2MaxCubemapSize, GL_RGB, 0, 0, 16, 16, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glCopyTexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_Z, log2MaxCubemapSize, GL_RGB, 0, 0, 16, 16, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glCopyTexImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_X, log2MaxCubemapSize, GL_RGB, 0, 0, 16, 16, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glCopyTexImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_Y, log2MaxCubemapSize, GL_RGB, 0, 0, 16, 16, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glCopyTexImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_Z, log2MaxCubemapSize, GL_RGB, 0, 0, 16, 16, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();
}